

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_table.cpp
# Opt level: O1

ColumnDefinition * __thiscall
duckdb::Transformer::TransformColumnDefinition
          (ColumnDefinition *__return_storage_ptr__,Transformer *this,PGColumnDef *cdef)

{
  ColumnCategory CVar1;
  char *__s;
  PGTypeName *type_name;
  ParserException *pPVar2;
  string name;
  string local_f0;
  LogicalType local_d0;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  LogicalType local_88;
  string local_70;
  string local_50;
  
  local_a0 = 0;
  local_98[0] = 0;
  __s = cdef->colname;
  local_a8 = local_98;
  if (__s != (char *)0x0) {
    strlen(__s);
    ::std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,(ulong)__s);
  }
  CVar1 = cdef->category;
  LogicalType::LogicalType(&local_d0);
  type_name = cdef->typeName;
  if (type_name == (PGTypeName *)0x0 && CVar1 == COL_GENERATED) {
    this = (Transformer *)0x3;
    LogicalType::LogicalType((LogicalType *)&local_f0,ANY);
  }
  else if (type_name == (PGTypeName *)0x0) {
    this = (Transformer *)0x2;
    LogicalType::LogicalType((LogicalType *)&local_f0,UNKNOWN);
  }
  else {
    TransformTypeName((LogicalType *)&local_f0,this,type_name);
  }
  local_d0.id_ = (LogicalTypeId)local_f0._M_dataplus._M_p;
  LogicalType::~LogicalType((LogicalType *)&local_f0);
  if (cdef->collClause != (PGCollateClause *)0x0) {
    if (cdef->category == COL_GENERATED) {
      pPVar2 = (ParserException *)__cxa_allocate_exception(0x10);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Collations are not supported on generated columns","");
      ParserException::ParserException(pPVar2,&local_f0);
      __cxa_throw(pPVar2,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (local_d0.id_ != VARCHAR) {
      pPVar2 = (ParserException *)__cxa_allocate_exception(0x10);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Only VARCHAR columns can have collations!","");
      ParserException::ParserException(pPVar2,&local_f0);
      __cxa_throw(pPVar2,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformCollation_abi_cxx11_(&local_50,this,cdef->collClause);
    LogicalType::VARCHAR_COLLATION((LogicalType *)&local_f0,&local_50);
    LogicalType::~LogicalType((LogicalType *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_a8,local_a8 + local_a0);
  LogicalType::LogicalType(&local_88,&local_d0);
  ColumnDefinition::ColumnDefinition(__return_storage_ptr__,&local_70,&local_88);
  LogicalType::~LogicalType(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  LogicalType::~LogicalType(&local_d0);
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

ColumnDefinition Transformer::TransformColumnDefinition(duckdb_libpgquery::PGColumnDef &cdef) {
	string name;
	if (cdef.colname) {
		name = cdef.colname;
	}

	auto optional_type = cdef.category == duckdb_libpgquery::COL_GENERATED;
	LogicalType target_type;
	if (optional_type && !cdef.typeName) {
		target_type = LogicalType::ANY;
	} else if (!cdef.typeName) {
		// ALTER TABLE tbl ALTER TYPE USING ...
		target_type = LogicalType::UNKNOWN;
	} else {
		target_type = TransformTypeName(*cdef.typeName);
	}

	if (cdef.collClause) {
		if (cdef.category == duckdb_libpgquery::COL_GENERATED) {
			throw ParserException("Collations are not supported on generated columns");
		}
		if (target_type.id() != LogicalTypeId::VARCHAR) {
			throw ParserException("Only VARCHAR columns can have collations!");
		}
		target_type = LogicalType::VARCHAR_COLLATION(TransformCollation(cdef.collClause));
	}

	return ColumnDefinition(name, target_type);
}